

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall cfdcapi_psbt_FundPsbt_Test::TestBody(cfdcapi_psbt_FundPsbt_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  char *in_stack_000000d0;
  int64_t in_stack_000000d8;
  uint32_t in_stack_000000e4;
  char *in_stack_000000e8;
  void *in_stack_000000f0;
  void *in_stack_000000f8;
  char *in_stack_00000110;
  char *in_stack_00000118;
  char *in_stack_00000120;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  uint32_t index_1;
  int64_t amount;
  uint32_t vout;
  char *descriptor;
  char *txid;
  uint32_t utxo_index;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  int64_t fee;
  uint32_t used_utxo_num;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  uint32_t index;
  CfdUtxo utxo_list [5];
  uint32_t utxo_list_num;
  AssertionResult gtest_ar_2;
  void *fund_handle;
  AssertionResult gtest_ar_1;
  char *output;
  char *exp_psbt_base64;
  void *psbt_handle;
  int net_type;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffff8f8;
  AssertionResult *in_stack_fffffffffffff900;
  char **in_stack_fffffffffffff908;
  char *in_stack_fffffffffffff910;
  void **in_stack_fffffffffffff918;
  char *in_stack_fffffffffffff9b0;
  AssertionResult *in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9c7;
  double in_stack_fffffffffffff9c8;
  void **in_stack_fffffffffffff9d0;
  AssertionResult *pAVar3;
  undefined4 in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9dc;
  void *in_stack_fffffffffffff9e0;
  void *in_stack_fffffffffffff9e8;
  AssertionResult *in_stack_fffffffffffffa30;
  undefined7 in_stack_fffffffffffffa38;
  undefined1 in_stack_fffffffffffffa3f;
  char *in_stack_fffffffffffffa40;
  AssertionResult *in_stack_fffffffffffffa48;
  AssertHelper local_4d8;
  Message local_4d0;
  undefined4 local_4c4;
  AssertionResult local_4c0;
  AssertHelper local_4b0;
  Message local_4a8;
  undefined4 local_49c;
  AssertionResult local_498;
  AssertHelper local_488;
  Message local_480;
  AssertionResult local_478;
  AssertHelper local_468;
  Message local_460;
  undefined4 local_454;
  AssertionResult local_450;
  AssertHelper local_440;
  Message local_438;
  undefined4 local_42c;
  AssertionResult local_428;
  AssertHelper local_418;
  Message local_410;
  undefined4 local_404;
  AssertionResult local_400;
  AssertHelper local_3f0;
  Message local_3e8;
  undefined4 local_3dc;
  AssertionResult local_3d8;
  AssertHelper local_3c8;
  Message local_3c0;
  AssertionResult local_3b8;
  AssertHelper local_3a8;
  Message local_3a0;
  AssertionResult local_398;
  AssertHelper local_388;
  Message local_380;
  AssertionResult local_378;
  AssertHelper local_368;
  Message local_360;
  AssertionResult local_358;
  AssertHelper local_348;
  Message local_340;
  undefined4 local_334;
  AssertionResult local_330;
  uint local_31c;
  undefined8 local_318;
  undefined4 local_30c;
  char *local_308;
  char *local_300;
  uint local_2f4;
  AssertHelper local_2f0;
  Message local_2e8;
  undefined4 local_2dc;
  AssertionResult local_2d8;
  AssertHelper local_2c8;
  Message local_2c0;
  undefined4 local_2b4;
  AssertionResult local_2b0;
  AssertHelper local_2a0;
  Message local_298;
  undefined4 local_28c;
  AssertionResult local_288;
  undefined8 local_278;
  uint local_26c;
  AssertHelper local_268;
  Message local_260;
  undefined4 local_254;
  AssertionResult local_250;
  AssertHelper local_240;
  Message local_238;
  undefined4 local_22c;
  AssertionResult local_228;
  uint32_t in_stack_fffffffffffffde8;
  uint32_t in_stack_fffffffffffffdec;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  int in_stack_fffffffffffffe04;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe08;
  uint local_1ec;
  undefined8 local_1e8;
  void **in_stack_fffffffffffffe20;
  uint32_t *in_stack_fffffffffffffec0;
  int64_t *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  void *in_stack_fffffffffffffed8;
  void *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  uint uVar4;
  AssertHelper local_110;
  Message local_108;
  undefined4 local_fc;
  AssertionResult local_f8;
  undefined8 local_e8;
  AssertHelper local_e0;
  Message local_d8;
  undefined4 local_cc;
  AssertionResult local_c8;
  char *local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar5;
  char **in_stack_ffffffffffffff68;
  uint32_t *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  AssertHelper in_stack_ffffffffffffff88;
  Message local_70;
  undefined1 local_61;
  int64_t *in_stack_ffffffffffffffa0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  AssertHelper in_stack_ffffffffffffffb0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb8;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffff918);
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffffb8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x390faa);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x367,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffb0,(Message *)&stack0xffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
    testing::Message::~Message((Message *)0x39100d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x391062);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,(type *)0x391096);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffa0);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffff68,(internal *)&stack0xffffffffffffffa0,
               (AssertionResult *)"(NULL == handle)","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x368,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff88,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff88);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    testing::Message::~Message((Message *)0x391192);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x39120d);
  uVar5 = 1;
  local_a8 = 0;
  local_b0 = 
  "cHNidP8BAP2GAQIAAAAH+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////PEJ8leyO15eW8T031SX76GhUXNkaHrDYn/kJgHMfOosHAAAAAP////8DgPD6AgAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5YDw+gIAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVXykZgAAAAAABYAFCtuFro44oBQD4CyxXBu8C841ZCBAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAABAR+AlpgAAAAAABYAFBzoeOOg2js0MIeX/ey3YiH4VBivIgYDwCMlwyj+1iKp2I+PUxjgUmGjw6lntyEdfWdlfiten74YKnBHYCwAAIAAAACAAAAAgAEAAAAHAAAAACICA0c7/Ix3DBsiCi56rkut9sDX6vKQKNWynTQ4ASuyie+BGCpwR2AsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgNkdK/yYzw1GGVTn7UrYrnW+55OI1dmKOHwoKeZNFjgbBida22GLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIC9/DX0AKJt8Wlgbw1J2BAw0jeSPxBQGfzHqJq2VwAVQwYKnBHYCwAAIAAAACAAAAAgAEAAABkAAAAAA=="
  ;
  local_b8 = (char *)0x0;
  local_14 = CfdCreatePsbtHandle(in_stack_fffffffffffffe08.ptr_,in_stack_fffffffffffffe04,
                                 (char *)CONCAT44(in_stack_fffffffffffffdfc,
                                                  in_stack_fffffffffffffdf8),
                                 (char *)in_stack_fffffffffffffdf0.ptr_,in_stack_fffffffffffffdec,
                                 in_stack_fffffffffffffde8,in_stack_fffffffffffffe20);
  local_cc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x391329);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x370,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message((Message *)0x39138c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3913e4);
  if (local_14 == 0) {
    local_e8 = 0;
    local_14 = CfdInitializeFundPsbt
                         ((void *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                          in_stack_fffffffffffff9d0);
    local_fc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
               (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
    if (!bVar1) {
      testing::Message::Message(&local_108);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3914c7);
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x374,pcVar2);
      testing::internal::AssertHelper::operator=(&local_110,&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      testing::Message::~Message((Message *)0x39152a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x391582);
    if (local_14 == 0) {
      uVar4 = 5;
      memcpy(&local_1e8,&PTR_anon_var_dwarf_beb76_009f5860,200);
      for (local_1ec = 0; local_1ec < uVar4; local_1ec = local_1ec + 1) {
        in_stack_fffffffffffff908 = (char **)0x0;
        in_stack_fffffffffffff900 = (AssertionResult *)0x0;
        local_14 = CfdFundPsbtAddToUtxoList
                             (in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,
                              in_stack_000000e4,in_stack_000000d8,in_stack_000000d0,
                              in_stack_00000110,in_stack_00000118,in_stack_00000120);
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                   (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffffe00);
        if (!bVar1) {
          testing::Message::Message((Message *)&stack0xfffffffffffffdf0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3916e1);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffde8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x396,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffde8,(Message *)&stack0xfffffffffffffdf0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffde8);
          testing::Message::~Message((Message *)0x391744);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x391799);
      }
      local_14 = CfdSetOptionFundPsbt
                           (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                            in_stack_fffffffffffff9dc,(int64_t)in_stack_fffffffffffff9d0,
                            in_stack_fffffffffffff9c8,(bool)in_stack_fffffffffffff9c7);
      local_22c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                 (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
      if (!bVar1) {
        testing::Message::Message(&local_238);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x39188b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_240,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x39b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_240,&local_238);
        testing::internal::AssertHelper::~AssertHelper(&local_240);
        testing::Message::~Message((Message *)0x3918ee);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x391946);
      local_14 = CfdSetOptionFundPsbt
                           (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                            in_stack_fffffffffffff9dc,(int64_t)in_stack_fffffffffffff9d0,
                            in_stack_fffffffffffff9c8,(bool)in_stack_fffffffffffff9c7);
      local_254 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                 (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_250);
      if (!bVar1) {
        testing::Message::Message(&local_260);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x391a1d);
        testing::internal::AssertHelper::AssertHelper
                  (&local_268,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x39e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_268,&local_260);
        testing::internal::AssertHelper::~AssertHelper(&local_268);
        testing::Message::~Message((Message *)0x391a80);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x391ad8);
      local_26c = 0;
      local_278 = 0;
      local_14 = CfdFinalizeFundPsbt((void *)CONCAT44(uVar4,in_stack_fffffffffffffee8),
                                     in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                                     in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                                     in_stack_fffffffffffffec0);
      local_28c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                 (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_288);
      if (!bVar1) {
        testing::Message::Message(&local_298);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x391bd7);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3a5,pcVar2);
        testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
        testing::internal::AssertHelper::~AssertHelper(&local_2a0);
        testing::Message::~Message((Message *)0x391c3a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x391c8f);
      local_2b4 = 1;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                 (int *)in_stack_fffffffffffff908,(uint *)in_stack_fffffffffffff900);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
      if (!bVar1) {
        testing::Message::Message(&local_2c0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x391d3c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3a6,pcVar2);
        testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
        testing::internal::AssertHelper::~AssertHelper(&local_2c8);
        testing::Message::~Message((Message *)0x391d9f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x391df4);
      local_2dc = 0x48e;
      in_stack_fffffffffffffa48 = &local_2d8;
      testing::internal::EqHelper<false>::Compare<int,long>
                ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                 (int *)in_stack_fffffffffffff908,(long *)in_stack_fffffffffffff900);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffa48);
      if (!bVar1) {
        testing::Message::Message(&local_2e8);
        in_stack_fffffffffffffa40 =
             testing::AssertionResult::failure_message((AssertionResult *)0x391ea1);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3a7,in_stack_fffffffffffffa40);
        testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
        testing::internal::AssertHelper::~AssertHelper(&local_2f0);
        testing::Message::~Message((Message *)0x391f04);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x391f5c);
      local_2f4 = 0;
      local_300 = (char *)0x0;
      local_308 = (char *)0x0;
      local_30c = 0;
      local_318 = 0;
      for (local_31c = 0; local_31c < local_26c; local_31c = local_31c + 1) {
        in_stack_fffffffffffff908 = &local_308;
        in_stack_fffffffffffff910 = (char *)0x0;
        in_stack_fffffffffffff900 = (AssertionResult *)0x0;
        local_14 = CfdGetFundPsbtUsedUtxo
                             (in_stack_ffffffffffffff88.data_,(void *)in_stack_ffffffffffffff80,
                              in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                              in_stack_ffffffffffffff68,
                              (uint32_t *)CONCAT44(uVar5,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffffa0,(char **)in_stack_ffffffffffffffa8.ptr_,
                              (char **)in_stack_ffffffffffffffb0.data_,
                              (char **)in_stack_ffffffffffffffb8.ptr_);
        local_334 = 0;
        in_stack_fffffffffffffa30 = &local_330;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                   (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
        in_stack_fffffffffffffa3f =
             testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffa30);
        if (!(bool)in_stack_fffffffffffffa3f) {
          testing::Message::Message(&local_340);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3920c7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_348,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                     ,0x3b1,pcVar2);
          testing::internal::AssertHelper::operator=(&local_348,&local_340);
          testing::internal::AssertHelper::~AssertHelper(&local_348);
          testing::Message::~Message((Message *)0x39212a);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x392182);
        if (local_14 == 0) {
          testing::internal::CmpHelperSTREQ
                    ((internal *)&local_358,"utxo_list[utxo_index].txid","txid",
                     (char *)(&local_1e8)[(ulong)local_2f4 * 5],local_300);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_358);
          if (!bVar1) {
            testing::Message::Message(&local_360);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x39223d);
            testing::internal::AssertHelper::AssertHelper
                      (&local_368,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x3b3,pcVar2);
            testing::internal::AssertHelper::operator=(&local_368,&local_360);
            testing::internal::AssertHelper::~AssertHelper(&local_368);
            testing::Message::~Message((Message *)0x3922a0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3922f5);
          testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                    ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                     (uint *)in_stack_fffffffffffff908,(uint *)in_stack_fffffffffffff900);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_378);
          if (!bVar1) {
            testing::Message::Message(&local_380);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3923a2);
            testing::internal::AssertHelper::AssertHelper
                      (&local_388,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x3b4,pcVar2);
            testing::internal::AssertHelper::operator=(&local_388,&local_380);
            testing::internal::AssertHelper::~AssertHelper(&local_388);
            testing::Message::~Message((Message *)0x392405);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x39245a);
          pAVar3 = &local_398;
          testing::internal::EqHelper<false>::Compare<long,long>
                    ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                     (long *)in_stack_fffffffffffff908,(long *)in_stack_fffffffffffff900);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
          if (!bVar1) {
            testing::Message::Message(&local_3a0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x392507);
            testing::internal::AssertHelper::AssertHelper
                      (&local_3a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x3b5,pcVar2);
            testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
            testing::internal::AssertHelper::~AssertHelper(&local_3a8);
            testing::Message::~Message((Message *)0x39256a);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3925bf);
          pAVar3 = &local_3b8;
          testing::internal::CmpHelperSTREQ
                    ((internal *)pAVar3,"utxo_list[utxo_index].descriptor","descriptor",
                     *(char **)(&stack0xfffffffffffffe30 + (ulong)local_2f4 * 0x28),local_308);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
          if (!bVar1) {
            testing::Message::Message(&local_3c0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x39266c);
            testing::internal::AssertHelper::AssertHelper
                      (&local_3c8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x3b6,pcVar2);
            testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
            testing::internal::AssertHelper::~AssertHelper(&local_3c8);
            testing::Message::~Message((Message *)0x3926cf);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x392727);
          local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff908);
          local_3dc = 0;
          in_stack_fffffffffffff9b8 = &local_3d8;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                     (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff9b8);
          if (!bVar1) {
            testing::Message::Message(&local_3e8);
            in_stack_fffffffffffff9b0 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x3927e8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_3f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x3b9,in_stack_fffffffffffff9b0);
            testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
            testing::internal::AssertHelper::~AssertHelper(&local_3f0);
            testing::Message::~Message((Message *)0x39284b);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3928a3);
          local_300 = (char *)0x0;
          local_14 = CfdFreeStringBuffer((char *)in_stack_fffffffffffff908);
          local_404 = 0;
          testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                    ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                     (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_400);
          if (!bVar1) {
            testing::Message::Message(&local_410);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x392970);
            testing::internal::AssertHelper::AssertHelper
                      (&local_418,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                       ,0x3bc,pcVar2);
            testing::internal::AssertHelper::operator=(&local_418,&local_410);
            testing::internal::AssertHelper::~AssertHelper(&local_418);
            testing::Message::~Message((Message *)0x3929d3);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x392a28);
          local_308 = (char *)0x0;
        }
      }
      local_14 = CfdFreeFundPsbt(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
      local_42c = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                 (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_428);
      if (!bVar1) {
        testing::Message::Message(&local_438);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x392b17);
        testing::internal::AssertHelper::AssertHelper
                  (&local_440,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3c2,pcVar2);
        testing::internal::AssertHelper::operator=(&local_440,&local_438);
        testing::internal::AssertHelper::~AssertHelper(&local_440);
        testing::Message::~Message((Message *)0x392b7a);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x392bcf);
    }
    local_14 = CfdGetPsbtData(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                              (char **)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38)
                              ,(char **)in_stack_fffffffffffffa30);
    local_454 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
               (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_450);
    if (!bVar1) {
      testing::Message::Message(&local_460);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x392ca0);
      testing::internal::AssertHelper::AssertHelper
                (&local_468,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x3c6,pcVar2);
      testing::internal::AssertHelper::operator=(&local_468,&local_460);
      testing::internal::AssertHelper::~AssertHelper(&local_468);
      testing::Message::~Message((Message *)0x392cfd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x392d52);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_478,"exp_psbt_base64","output",local_b0,local_b8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_478);
      if (!bVar1) {
        testing::Message::Message(&local_480);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x392df6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_488,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x3c8,pcVar2);
        testing::internal::AssertHelper::operator=(&local_488,&local_480);
        testing::internal::AssertHelper::~AssertHelper(&local_488);
        testing::Message::~Message((Message *)0x392e53);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x392ea8);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffff908);
      local_b8 = (char *)0x0;
    }
    local_14 = CfdFreePsbtHandle(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
    local_49c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
               (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_498);
    if (!bVar1) {
      testing::Message::Message(&local_4a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x392f80);
      testing::internal::AssertHelper::AssertHelper
                (&local_4b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x3ce,pcVar2);
      testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
      testing::internal::AssertHelper::~AssertHelper(&local_4b0);
      testing::Message::~Message((Message *)0x392fdd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x393032);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffff908);
  local_4c4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             (CfdErrorCode *)in_stack_fffffffffffff908,(int *)in_stack_fffffffffffff900);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3930e9);
    testing::internal::AssertHelper::AssertHelper
              (&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x3d2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&local_4d8);
    testing::Message::~Message((Message *)0x393146);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x39319b);
  return;
}

Assistant:

TEST(cfdcapi_psbt, FundPsbt) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* exp_psbt_base64 = "cHNidP8BAP2GAQIAAAAH+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////PEJ8leyO15eW8T031SX76GhUXNkaHrDYn/kJgHMfOosHAAAAAP////8DgPD6AgAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5YDw+gIAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVXykZgAAAAAABYAFCtuFro44oBQD4CyxXBu8C841ZCBAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAABAR+AlpgAAAAAABYAFBzoeOOg2js0MIeX/ey3YiH4VBivIgYDwCMlwyj+1iKp2I+PUxjgUmGjw6lntyEdfWdlfiten74YKnBHYCwAAIAAAACAAAAAgAEAAAAHAAAAACICA0c7/Ix3DBsiCi56rkut9sDX6vKQKNWynTQ4ASuyie+BGCpwR2AsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgNkdK/yYzw1GGVTn7UrYrnW+55OI1dmKOHwoKeZNFjgbBida22GLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIC9/DX0AKJt8Wlgbw1J2BAw0jeSPxBQGfzHqJq2VwAVQwYKnBHYCwAAIAAAACAAAAAgAEAAABkAAAAAA==";
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, "cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAABAR+AlpgAAAAAABYAFJYsTgjzNtOvvDQVydNZrhBARwUgIgYCVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv4YKnBHYCwAAIAAAACAAAAAgAEAAAABAAAAAAEBH4CWmAAAAAAAFgAUi/CdYLfjTzSCfY28scdjkKkWyoIiBgInRM+yQ24VYEDsHI/oQtnvmhjLQK1B8xJyU5DDX3vTaxgqcEdgLAAAgAAAAIAAAACAAQAAAAIAAAAAAQEfgJaYAAAAAAAWABTx0+5ngpIl64ksyrAeIvand+fiHiIGAufo3CNvoCQ2lAjSzk2FCASCYavCl7gRYE2gh61x0ThVGCpwR2AsAACAAAAAgAAAAIABAAAAAwAAAAABAR+AlpgAAAAAABYAFBnWX4MosiBtmXB4VmDsDTSAj7B1IgYDPYdL8ZtpfPbGOWWVR6WDuGcwFkpbbbAb8goU65tq20QYKnBHYCwAAIAAAACAAAAAgAEAAAAEAAAAAAEBH4CWmAAAAAAAFgAUEreVSnXvwqIOhuMtwteGR9ZwB3kiBgL7Bhcw2948gGtKF6mfRUyBKCrs7m1G9Kl1qUzf06BlBBgqcEdgLAAAgAAAAIAAAACAAQAAAAUAAAAAAQEfgPD6AgAAAAAWABSXipBGDkRnGlL0mgm7WcxnlLY8iSIGA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rsGJ1rbYYsAACAAAAAgAAAAIABAAAAAQAAAAAiAgNHO/yMdwwbIgoueq5LrfbA1+rykCjVsp00OAErsonvgRgqcEdgLAAAgAAAAIAAAACAAAAAAAIAAAAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==", "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    void* fund_handle = nullptr;
    ret = CfdInitializeFundPsbt(handle, &fund_handle);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      uint32_t utxo_list_num = 5;
      CfdUtxo utxo_list[] = {
        {
           "8b3a1f738009f99fd8b01e1ad95c5468e8fb25d5373df19697d78eec957c423c", 7, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/7]03c02325c328fed622a9d88f8f5318e05261a3c3a967b7211d7d67657e2b5e9fbe)",
           nullptr
        },
        {
           "0e5b0e16148da878ee8d9f0524ac0962a22dbbb66e2dc8a6237a1d4c8c4ea9cb", 8, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/8]02f505e0b5885959bd2f7e68dd73915940a5540e05c41a42f6c598ceb21bdc55f3)",
           nullptr
        },
        {
           "016b36a0a9df54d55f7b907aba8fdd3d90d797eee2bc46c5ed7dced41218e674", 9, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/9]02f7af7e1c3c8627e0e662ba04ec003879d9aeaeba5a02a1e24804ef4d7b497db4)",
           nullptr
        },
        {
           "dcc65ebfb8535f96f8a51e07d5c0a94f965000bd5765159a3cc27e4edd658c69", 10, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/10]03c04e76f9bc7d6433a6eb7c0c3c446213c5f361dae22929483f23718e1cee4ece)",
           nullptr
        },
        {
           "0230e7471501f9432f727583f2bc17c11f5c1132140319ba2d7a5a0145684c73", 11, 10000000,
           "wpkh([2a704760/44'/0'/0'/1/11]03798ff13e5d17c6f8c1d69ff18d516613be2fa52149b3a8c60ef959d1075a5889)",
           nullptr
        }
      };
      for (uint32_t index=0; index<utxo_list_num; ++index) {
        ret = CfdFundPsbtAddToUtxoList(handle, fund_handle, utxo_list[index].txid,
            utxo_list[index].vout, utxo_list[index].amount, nullptr, utxo_list[index].descriptor,
            nullptr, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
      }

      ret = CfdSetOptionFundPsbt(handle, fund_handle, kCfdPsbtFundEstimateFeeRate,
          0, 2.0, false);
      EXPECT_EQ(kCfdSuccess, ret);
      ret = CfdSetOptionFundPsbt(handle, fund_handle, kCfdPsbtFundKnapsackMinChange,
          0, 0, false);
      EXPECT_EQ(kCfdSuccess, ret);

      uint32_t used_utxo_num = 0;
      int64_t fee = 0;
      ret = CfdFinalizeFundPsbt(handle, psbt_handle, fund_handle,
          "wpkh([2a704760/44'/0'/0'/1/100]02f7f0d7d00289b7c5a581bc35276040c348de48fc414067f31ea26ad95c00550c)",
          &fee, &used_utxo_num);
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(1, used_utxo_num);
      EXPECT_EQ(1166, fee);

      uint32_t utxo_index = 0;
      char* txid = nullptr;
      char* descriptor = nullptr;
      uint32_t vout = 0;
      int64_t amount = 0;
      for (uint32_t index=0; index<used_utxo_num; ++index) {
        ret = CfdGetFundPsbtUsedUtxo(handle, fund_handle, index, &utxo_index,
            &txid, &vout, &amount, nullptr, &descriptor, nullptr);
        EXPECT_EQ(kCfdSuccess, ret);
        if (ret == kCfdSuccess) {
          EXPECT_STREQ(utxo_list[utxo_index].txid, txid);
          EXPECT_EQ(utxo_list[utxo_index].vout, vout);
          EXPECT_EQ(utxo_list[utxo_index].amount, amount);
          EXPECT_STREQ(utxo_list[utxo_index].descriptor, descriptor);

          ret = CfdFreeStringBuffer(txid);
          EXPECT_EQ(kCfdSuccess, ret);
          txid = nullptr;
          ret = CfdFreeStringBuffer(descriptor);
          EXPECT_EQ(kCfdSuccess, ret);
          descriptor = nullptr;
        }
      }

      ret = CfdFreeFundPsbt(handle, fund_handle);
      EXPECT_EQ(kCfdSuccess, ret);
    }

    ret = CfdGetPsbtData(handle, psbt_handle, &output, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_psbt_base64, output);
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}